

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O1

void __thiscall chrono::ChNodeSPH::ComputeJacobianForContactPart(ChNodeSPH *this)

{
  type_constraint_tuple *in_RCX;
  ChMatrix33<double> *in_RDX;
  ChVector<double> *in_RSI;
  type_constraint_tuple *in_R8;
  type_constraint_tuple *in_R9;
  bool in_stack_00000008;
  
  ComputeJacobianForContactPart(this,in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_00000008);
  return;
}

Assistant:

void ChNodeSPH::ComputeJacobianForContactPart(const ChVector<>& abs_point,
                                              ChMatrix33<>& contact_plane,
                                              type_constraint_tuple& jacobian_tuple_N,
                                              type_constraint_tuple& jacobian_tuple_U,
                                              type_constraint_tuple& jacobian_tuple_V,
                                              bool second) {
    ChMatrix33<> Jx1 = contact_plane.transpose();
    if (!second)
        Jx1 *= -1;

    jacobian_tuple_N.Get_Cq().segment(0, 3) = Jx1.row(0);
    jacobian_tuple_U.Get_Cq().segment(0, 3) = Jx1.row(1);
    jacobian_tuple_V.Get_Cq().segment(0, 3) = Jx1.row(2);
}